

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall hwnet::Buffer::Append(Buffer *this,char *ptr,size_t l)

{
  ulong uVar1;
  size_t cap_;
  Ptr newbuff;
  
  if (l != 0 && ptr != (char *)0x0) {
    uVar1 = this->len;
    if (!CARRY8(uVar1,l)) {
      if (this->cap < uVar1 + l) {
        std::make_shared<hwnet::Buffer::bytes,unsigned_long&>((unsigned_long *)&cap_);
        memcpy(*(void **)cap_,
               ((this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->ptr + this->b,this->len);
        this->cap = uVar1 + l;
        std::__shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2> *)&cap_);
        this->b = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newbuff);
        uVar1 = this->len;
      }
      memcpy(((this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->ptr + this->b + uVar1,ptr,l);
      this->len = this->len + l;
    }
  }
  return;
}

Assistant:

void Append(const char *ptr,size_t l) {
		if(ptr && l > 0) {
			auto need = this->len + l;
			if(need < this->len) {
				//overflow
				return;
			}

			if(need > this->cap) {
				//扩容
				size_t cap_ = need;
				bytes::Ptr newbuff = std::make_shared<bytes>(cap_);
				memcpy(newbuff->ptr,this->buff->ptr + this->b,this->len);
				this->cap = cap_;
				this->buff = newbuff;
				this->b = 0;
			}
			memcpy(this->buff->ptr + this->len + this->b , ptr , l);
			this->len += l;			
		}
	}